

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedPrematureExitFile::~ScopedPrematureExitFile(ScopedPrematureExitFile *this)

{
  int iVar1;
  ulong uVar2;
  char *__filename;
  ostream *poVar3;
  long in_FS_OFFSET;
  int retval;
  ScopedPrematureExitFile *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    iVar1 = remove(__filename);
    if (iVar1 != 0) {
      GTestLog::GTestLog((GTestLog *)((long)&this_local + 4),GTEST_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest.cc"
                         ,0x112d);
      poVar3 = GTestLog::GetStream((GTestLog *)((long)&this_local + 4));
      poVar3 = std::operator<<(poVar3,"Failed to remove premature exit filepath \"");
      poVar3 = std::operator<<(poVar3,(string *)this);
      poVar3 = std::operator<<(poVar3,"\" with error ");
      std::ostream::operator<<(poVar3,iVar1);
      GTestLog::~GTestLog((GTestLog *)((long)&this_local + 4));
    }
  }
  std::__cxx11::string::~string((string *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~ScopedPrematureExitFile() {
    if (!premature_exit_filepath_.empty()) {
      int retval = remove(premature_exit_filepath_.c_str());
      if (retval) {
        GTEST_LOG_(ERROR) << "Failed to remove premature exit filepath \""
                          << premature_exit_filepath_ << "\" with error "
                          << retval;
      }
    }
  }